

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  uint32_t number;
  OneofDescriptor *pOVar1;
  
  WriteUInt32ToUtf16CharSequence
            (((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_)->number_,output);
  number = GetExperimentalJavaFieldType
                     ((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  pOVar1 = FieldDescriptor::containing_oneof
                     ((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  WriteUInt32ToUtf16CharSequence
            ((uint32_t)(((long)pOVar1 - (long)pOVar1->containing_type_->oneof_decls_) / 0x38),output
            );
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
}